

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O1

void __thiscall Mutex::Mutex(Mutex *this)

{
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_14;
  
  pthread_mutexattr_init(&local_14);
  pthread_mutexattr_settype(&local_14,1);
  pthread_mutex_init((pthread_mutex_t *)this,&local_14);
  pthread_mutexattr_destroy(&local_14);
  return;
}

Assistant:

Mutex::Mutex()
{
#if PLATFORM_WIN
#if PLATFORM_WINRT
    BOOL const result = InitializeCriticalSectionEx(&crit_sec, 0, CRITICAL_SECTION_NO_DEBUG_INFO);
    assert(FALSE != result);
#else
    InitializeCriticalSection(&crit_sec);
#endif
#else
    pthread_mutexattr_t attr;
    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    pthread_mutex_init(&mutex, &attr);
    pthread_mutexattr_destroy(&attr);
#endif
}